

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int oog_encode(double u,double v)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int local_37c;
  int local_378;
  int i2;
  int i1;
  int ustep;
  int vi;
  int ui;
  double epsa;
  double ang;
  double va;
  double ua;
  double eps [100];
  int local_1c;
  int i;
  double v_local;
  double u_local;
  
  if (oog_encode::initialized == 0) {
    local_1c = 100;
    while (local_1c != 0) {
      eps[(long)(local_1c + -1) + -1] = 2.0;
      local_1c = local_1c + -1;
    }
    i1 = 0xa3;
    while (iVar2 = i1 + -1, i1 != 0) {
      i2 = uv_row[iVar2].nus + -1;
      if (((iVar2 == 0xa2) || (iVar2 == 0)) || (i2 < 1)) {
        i2 = 1;
      }
      for (ustep = uv_row[iVar2].nus + -1; i1 = iVar2, -1 < ustep; ustep = ustep - i2) {
        dVar3 = atan2((((double)iVar2 + 0.5) * 0.0035000001080334187 + 0.016939999535679817) -
                      0.473684211,
                      (((double)ustep + 0.5) * 0.0035000001080334187 + (double)uv_row[iVar2].ustart)
                      - 0.210526316);
        dVar3 = dVar3 * 15.915494277358546 + 50.0;
        iVar1 = (int)dVar3;
        dVar3 = ABS(dVar3 - ((double)iVar1 + 0.5));
        if (dVar3 < eps[(long)iVar1 + -1]) {
          oog_encode::oog_table[iVar1] = uv_row[iVar2].ncum + ustep;
          eps[(long)iVar1 + -1] = dVar3;
        }
      }
    }
    local_1c = 100;
    iVar2 = local_1c;
    while (local_1c = iVar2, iVar2 = local_1c + -1, local_1c != 0) {
      if (1.5 < eps[(long)iVar2 + -1]) {
        local_378 = 1;
        while ((local_378 < 0x32 &&
               (1.5 < eps[(long)((iVar2 + local_378) % 100) + -1] ||
                eps[(long)((iVar2 + local_378) % 100) + -1] == 1.5))) {
          local_378 = local_378 + 1;
        }
        local_37c = 1;
        while ((local_37c < 0x32 &&
               (1.5 < eps[(long)(((local_1c + 99) - local_37c) % 100) + -1] ||
                eps[(long)(((local_1c + 99) - local_37c) % 100) + -1] == 1.5))) {
          local_37c = local_37c + 1;
        }
        if (local_378 < local_37c) {
          oog_encode::oog_table[iVar2] = oog_encode::oog_table[(iVar2 + local_378) % 100];
        }
        else {
          oog_encode::oog_table[iVar2] = oog_encode::oog_table[((local_1c + 99) - local_37c) % 100];
        }
      }
    }
    oog_encode::initialized = 1;
  }
  dVar3 = atan2(v - 0.473684211,u - 0.210526316);
  return oog_encode::oog_table[(int)(dVar3 * 15.915494277358546 + 50.0)];
}

Assistant:

static int oog_encode(double u, double v) /* encode out-of-gamut chroma */
{
    static int oog_table[NANGLES];
    static int initialized = 0;
    register int i;

    if (!initialized)
    { /* set up perimeter table */
        double eps[NANGLES], ua, va, ang, epsa;
        int ui, vi, ustep;
        for (i = NANGLES; i--;)
            eps[i] = 2.;
        for (vi = UV_NVS; vi--;)
        {
            va = UV_VSTART + (vi + .5) * UV_SQSIZ;
            ustep = uv_row[vi].nus - 1;
            if (vi == UV_NVS - 1 || vi == 0 || ustep <= 0)
                ustep = 1;
            for (ui = uv_row[vi].nus - 1; ui >= 0; ui -= ustep)
            {
                ua = uv_row[vi].ustart + (ui + .5) * UV_SQSIZ;
                ang = uv2ang(ua, va);
                i = (int)ang;
                epsa = fabs(ang - (i + .5));
                if (epsa < eps[i])
                {
                    oog_table[i] = uv_row[vi].ncum + ui;
                    eps[i] = epsa;
                }
            }
        }
        for (i = NANGLES; i--;) /* fill any holes */
            if (eps[i] > 1.5)
            {
                int i1, i2;
                for (i1 = 1; i1 < NANGLES / 2; i1++)
                    if (eps[(i + i1) % NANGLES] < 1.5)
                        break;
                for (i2 = 1; i2 < NANGLES / 2; i2++)
                    if (eps[(i + NANGLES - i2) % NANGLES] < 1.5)
                        break;
                if (i1 < i2)
                    oog_table[i] = oog_table[(i + i1) % NANGLES];
                else
                    oog_table[i] = oog_table[(i + NANGLES - i2) % NANGLES];
            }
        initialized = 1;
    }
    i = (int)uv2ang(u, v); /* look up hue angle */
    return (oog_table[i]);
}